

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testInit(XFBCaptureUnsizedArrayTest *this)

{
  value_type local_18;
  STAGES local_14;
  testCase test_case;
  GLuint stage;
  XFBCaptureUnsizedArrayTest *this_local;
  
  _test_case = this;
  for (local_14 = COMPUTE; local_14 < STAGE_MAX; local_14 = local_14 + VERTEX) {
    if ((((local_14 != COMPUTE) && (local_14 != FRAGMENT)) && (local_14 != GEOMETRY)) &&
       (local_14 != TESS_EVAL)) {
      local_18.m_stage = local_14;
      std::
      vector<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_18);
    }
  }
  return;
}

Assistant:

void XFBCaptureUnsizedArrayTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		/* Not aplicable for */
		if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::FRAGMENT == stage) ||
			(Utils::Shader::GEOMETRY == stage) || (Utils::Shader::TESS_EVAL == stage))
		{
			continue;
		}

		testCase test_case = { (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case);
	}
}